

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int luaL_typerror(lua_State *L,int narg,char *tname)

{
  TValue *pTVar1;
  int iVar2;
  char *pcVar3;
  
  pTVar1 = index2adr(L,narg);
  iVar2 = -1;
  if (pTVar1 != &luaO_nilobject_) {
    iVar2 = pTVar1->tt;
  }
  if (iVar2 == -1) {
    pcVar3 = "no value";
  }
  else {
    pcVar3 = luaT_typenames[iVar2];
  }
  pcVar3 = lua_pushfstring(L,"%s expected, got %s",tname,pcVar3);
  luaL_argerror(L,narg,pcVar3);
}

Assistant:

static int luaL_typerror(lua_State*L,int narg,const char*tname){
const char*msg=lua_pushfstring(L,"%s expected, got %s",
tname,luaL_typename(L,narg));
return luaL_argerror(L,narg,msg);
}